

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineBlocker.cpp
# Opt level: O0

void __thiscall
tiger::trains::ai::LineBlocker::LineBlocker
          (LineBlocker *this,Train *train,GoodType type,BotSharedData *data)

{
  set<std::pair<int,_tiger::trains::ai::LineBlock>,_std::less<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
  *psVar1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  *(undefined4 *)(in_RDI + 1) = in_EDX;
  in_RDI[2] = in_RCX;
  std::
  set<tiger::trains::ai::LineBlock,_std::less<tiger::trains::ai::LineBlock>,_std::allocator<tiger::trains::ai::LineBlock>_>
  ::set((set<tiger::trains::ai::LineBlock,_std::less<tiger::trains::ai::LineBlock>,_std::allocator<tiger::trains::ai::LineBlock>_>
         *)0x252517);
  std::
  vector<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
  ::vector((vector<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
            *)0x25252a);
  psVar1 = BotSharedData::getBlockLines((BotSharedData *)in_RDI[2]);
  in_RDI[3] = psVar1;
  return;
}

Assistant:

LineBlocker::LineBlocker(world::Train *train, models::GoodType type, BotSharedData *data)
    : train(train), type(type), sharedData(data)
{
    blockLines = sharedData->getBlockLines();
}